

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall Trainer::Node::Node(Node *this,int actionNum)

{
  size_t __n;
  undefined1 auVar1 [16];
  double *__s;
  double *pdVar2;
  double *__s_00;
  double *__s_01;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this->mActionNum = (uint8_t)actionNum;
  this->mAlreadyCalculated = false;
  this->mNeedToUpdateStrategy = false;
  __n = (ulong)(uint)actionNum * 8;
  uVar5 = 0xffffffffffffffff;
  if (-1 < actionNum) {
    uVar5 = __n;
  }
  __s = (double *)operator_new__(uVar5);
  this->mRegretSum = __s;
  pdVar2 = (double *)operator_new__(uVar5);
  this->mStrategy = pdVar2;
  __s_00 = (double *)operator_new__(uVar5);
  this->mStrategySum = __s_00;
  __s_01 = (double *)operator_new__(uVar5);
  this->mAverageStrategy = __s_01;
  if (0 < actionNum) {
    lVar3 = 0;
    memset(__s,0,__n);
    memset(__s_00,0,__n);
    memset(__s_01,0,__n);
    auVar1 = _DAT_0011bb90;
    lVar4 = (ulong)(uint)actionNum - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar6 = auVar6 ^ _DAT_0011bb90;
    auVar7 = _DAT_0011bb80;
    do {
      auVar8 = auVar7 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(double *)((long)pdVar2 + lVar3) = 1.0 / (double)actionNum;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(double *)((long)pdVar2 + lVar3 + 8) = 1.0 / (double)actionNum;
      }
      lVar4 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar4 + 2;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(actionNum + 1U >> 1) << 4 != lVar3);
  }
  return;
}

Assistant:

Node::Node(const int actionNum) : mActionNum(actionNum), mAlreadyCalculated(false), mNeedToUpdateStrategy(false) {
    mRegretSum = new double[actionNum];
    mStrategy = new double[actionNum];
    mStrategySum = new double[actionNum];
    mAverageStrategy = new double[actionNum];
    for (int a = 0; a < actionNum; ++a) {
        mRegretSum[a] = 0.0;
        mStrategy[a] = 1.0 / (double) actionNum;
        mStrategySum[a] = 0.0;
        mAverageStrategy[a] = 0.0;
    }
}